

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O2

char * parse_offset(int *secs,char *p,size_t *len)

{
  ulong uVar1;
  ushort **ppuVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int mm;
  int hh;
  int ss;
  
  hh = 0;
  mm = 0;
  ss = 0;
  uVar1 = *len;
  if (uVar1 < 2) {
    if (uVar1 == 0) {
      return p;
    }
LAB_001f045c:
    iVar3 = 1;
    ppuVar2 = __ctype_b_loc();
  }
  else {
    if (*p == '-') {
      ppuVar2 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar2 + (long)p[1] * 2 + 1) & 8) == 0) goto LAB_001f045c;
      *len = uVar1 - 1;
      iVar3 = -1;
    }
    else {
      if ((*p != '+') ||
         (ppuVar2 = __ctype_b_loc(), (*(byte *)((long)*ppuVar2 + (long)p[1] * 2 + 1) & 8) == 0))
      goto LAB_001f045c;
      *len = uVar1 - 1;
      iVar3 = 1;
    }
    p = p + 1;
  }
  if ((*(byte *)((long)*ppuVar2 + (long)*p * 2 + 1) & 8) != 0) {
    p = parse_digits(&hh,p,len);
    iVar4 = 0;
    iVar5 = 0;
    if ((((2 < *len) && (iVar5 = iVar4, *p == ':')) &&
        ((*(byte *)((long)*ppuVar2 + (long)p[1] * 2 + 1) & 8) != 0)) &&
       ((*(byte *)((long)*ppuVar2 + (long)p[2] * 2 + 1) & 8) != 0)) {
      *len = *len - 1;
      p = parse_digits(&mm,p + 1,len);
      if (((2 < *len) && (*p == ':')) &&
         (((*(byte *)((long)*ppuVar2 + (long)p[1] * 2 + 1) & 8) != 0 &&
          ((*(byte *)((long)*ppuVar2 + (long)p[2] * 2 + 1) & 8) != 0)))) {
        *len = *len - 1;
        p = parse_digits(&ss,p + 1,len);
        iVar5 = ss;
      }
    }
    *secs = (mm * 0x3c + hh * 0xe10 + iVar5) * iVar3;
  }
  return p;
}

Assistant:

static const char *parse_offset(int *secs, const char *p, size_t *len)
{
    int sign = 1, hh = 0, mm = 0, ss = 0;
    
    /* check for a sign (which must be followed by a digit) */
    if (*len >= 2 && *p == '+' && isdigit(p[1]))
        ++p, --*len;
    else if (*len >= 2 && *p == '-' && isdigit(p[1]))
        sign = -1, ++p, --*len;

    /* if we don't have a digit, it's not a number */
    if (*len == 0 || !isdigit(*p))
        return p;

    /* parse the hours */
    p = parse_digits(&hh, p, len);

    /* check for minutes */
    if (*len >= 3 && *p == ':' && isdigit(p[1]) && isdigit(p[2]))
    {
        /* parse the minutes */
        ++p, --*len;
        p = parse_digits(&mm, p, len);

        /* check for seconds */
        if (*len >= 3 && *p == ':' && isdigit(p[1]) && isdigit(p[2]))
        {
            ++p, --*len;
            p = parse_digits(&ss, p, len);
        }
    }

    /* compute the full time in seconds, and apply the sign */
    *secs = sign*(hh*60*60 + mm*60 + ss);

    /* return the updated pointer */
    return p;
}